

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompilationUnitSymbols.cpp
# Opt level: O1

void __thiscall
slang::ast::ConfigBlockSymbol::registerRules(ConfigBlockSymbol *this,InstanceOverride *node)

{
  char_pointer puVar1;
  size_t *psVar2;
  group_type_pointer pgVar3;
  undefined4 uVar4;
  ConfigRule *pCVar5;
  group_type_pointer pgVar6;
  int iVar7;
  uint uVar8;
  undefined1 auVar9 [16];
  ulong uVar10;
  ulong pos0;
  char_pointer puVar11;
  uint uVar12;
  pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigRule_*> *ppVar14;
  ulong hash;
  char_pointer puVar15;
  ulong uVar16;
  uchar uVar17;
  uchar uVar19;
  uchar uVar20;
  uchar uVar21;
  undefined1 auVar18 [16];
  undefined1 auVar22 [16];
  iterator iVar23;
  locator res;
  try_emplace_args_t local_71;
  flat_hash_map<const_syntax::SyntaxNode_*,_const_ConfigRule_*> *local_70;
  SyntaxNode *local_68;
  ulong local_60;
  value_type_pointer local_58;
  ulong local_50;
  locator local_48;
  table_element_pointer ppVar13;
  
  pCVar5 = node->rule;
  if (pCVar5 != (ConfigRule *)0x0) {
    local_70 = &this->ruleBySyntax;
    local_68 = (pCVar5->syntax).ptr;
    auVar9._8_8_ = 0;
    auVar9._0_8_ = local_68;
    hash = SUB168(auVar9 * ZEXT816(0x9e3779b97f4a7c15),8) ^
           SUB168(auVar9 * ZEXT816(0x9e3779b97f4a7c15),0);
    pos0 = hash >> ((byte)(this->ruleBySyntax).table_.
                          super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_const_slang::ast::ConfigRule_*>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigRule_*>_>_>
                          .arrays.groups_size_index & 0x3f);
    pgVar6 = (this->ruleBySyntax).table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_const_slang::ast::ConfigRule_*>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigRule_*>_>_>
             .arrays.groups_;
    uVar4 = (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>
              ::match_word(unsigned_long)::word)[hash & 0xff];
    local_58 = (this->ruleBySyntax).table_.
               super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_const_slang::ast::ConfigRule_*>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigRule_*>_>_>
               .arrays.elements_;
    local_60 = (this->ruleBySyntax).table_.
               super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_const_slang::ast::ConfigRule_*>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigRule_*>_>_>
               .arrays.groups_size_mask;
    uVar10 = 0;
    uVar16 = pos0;
    do {
      local_50 = uVar10;
      pgVar3 = pgVar6 + uVar16;
      uVar17 = (uchar)uVar4;
      auVar22[0] = -(pgVar3->m[0].n == uVar17);
      uVar19 = (uchar)((uint)uVar4 >> 8);
      auVar22[1] = -(pgVar3->m[1].n == uVar19);
      uVar20 = (uchar)((uint)uVar4 >> 0x10);
      auVar22[2] = -(pgVar3->m[2].n == uVar20);
      uVar21 = (uchar)((uint)uVar4 >> 0x18);
      auVar22[3] = -(pgVar3->m[3].n == uVar21);
      auVar22[4] = -(pgVar3->m[4].n == uVar17);
      auVar22[5] = -(pgVar3->m[5].n == uVar19);
      auVar22[6] = -(pgVar3->m[6].n == uVar20);
      auVar22[7] = -(pgVar3->m[7].n == uVar21);
      auVar22[8] = -(pgVar3->m[8].n == uVar17);
      auVar22[9] = -(pgVar3->m[9].n == uVar19);
      auVar22[10] = -(pgVar3->m[10].n == uVar20);
      auVar22[0xb] = -(pgVar3->m[0xb].n == uVar21);
      auVar22[0xc] = -(pgVar3->m[0xc].n == uVar17);
      auVar22[0xd] = -(pgVar3->m[0xd].n == uVar19);
      auVar22[0xe] = -(pgVar3->m[0xe].n == uVar20);
      auVar22[0xf] = -(pgVar3->m[0xf].n == uVar21);
      for (uVar12 = (uint)(ushort)((ushort)(SUB161(auVar22 >> 7,0) & 1) |
                                   (ushort)(SUB161(auVar22 >> 0xf,0) & 1) << 1 |
                                   (ushort)(SUB161(auVar22 >> 0x17,0) & 1) << 2 |
                                   (ushort)(SUB161(auVar22 >> 0x1f,0) & 1) << 3 |
                                   (ushort)(SUB161(auVar22 >> 0x27,0) & 1) << 4 |
                                   (ushort)(SUB161(auVar22 >> 0x2f,0) & 1) << 5 |
                                   (ushort)(SUB161(auVar22 >> 0x37,0) & 1) << 6 |
                                   (ushort)(SUB161(auVar22 >> 0x3f,0) & 1) << 7 |
                                   (ushort)(SUB161(auVar22 >> 0x47,0) & 1) << 8 |
                                   (ushort)(SUB161(auVar22 >> 0x4f,0) & 1) << 9 |
                                   (ushort)(SUB161(auVar22 >> 0x57,0) & 1) << 10 |
                                   (ushort)(SUB161(auVar22 >> 0x5f,0) & 1) << 0xb |
                                   (ushort)(SUB161(auVar22 >> 0x67,0) & 1) << 0xc |
                                   (ushort)(SUB161(auVar22 >> 0x6f,0) & 1) << 0xd |
                                  (ushort)(SUB161(auVar22 >> 0x77,0) & 1) << 0xe); uVar12 != 0;
          uVar12 = uVar12 - 1 & uVar12) {
        iVar7 = 0;
        if (uVar12 != 0) {
          for (; (uVar12 >> iVar7 & 1) == 0; iVar7 = iVar7 + 1) {
          }
        }
        if (local_68 ==
            *(SyntaxNode **)((long)&local_58[uVar16 * 0xf].first + (ulong)(uint)(iVar7 << 4))) {
          ppVar14 = (pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigRule_*> *)
                    ((long)&local_58[uVar16 * 0xf].first + (ulong)(uint)(iVar7 << 4));
          goto LAB_0078996e;
        }
      }
      if ((pgVar6[uVar16].m[0xf].n &
          (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
            is_not_overflowed(unsigned_long)::shift)[(uint)hash & 7]) == 0) break;
      uVar16 = uVar16 + local_50 + 1 & local_60;
      uVar10 = local_50 + 1;
    } while (local_50 + 1 <= local_60);
    ppVar14 = (pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigRule_*> *)0x0;
LAB_0078996e:
    if (ppVar14 ==
        (pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigRule_*> *)0x0) {
      if ((this->ruleBySyntax).table_.
          super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_const_slang::ast::ConfigRule_*>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigRule_*>_>_>
          .size_ctrl.size <
          (this->ruleBySyntax).table_.
          super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_const_slang::ast::ConfigRule_*>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigRule_*>_>_>
          .size_ctrl.ml) {
        boost::unordered::detail::foa::
        table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxNode_const*,slang::ast::ConfigRule_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxNode_const*,void>,std::equal_to<slang::syntax::SyntaxNode_const*>,std::allocator<std::pair<slang::syntax::SyntaxNode_const*const,slang::ast::ConfigRule_const*>>>
        ::
        nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::syntax::SyntaxNode_const*>
                  (&local_48,
                   (table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxNode_const*,slang::ast::ConfigRule_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxNode_const*,void>,std::equal_to<slang::syntax::SyntaxNode_const*>,std::allocator<std::pair<slang::syntax::SyntaxNode_const*const,slang::ast::ConfigRule_const*>>>
                    *)local_70,(arrays_type *)local_70,pos0,hash,&local_71,&local_68);
        psVar2 = &(this->ruleBySyntax).table_.
                  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_const_slang::ast::ConfigRule_*>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigRule_*>_>_>
                  .size_ctrl.size;
        *psVar2 = *psVar2 + 1;
        ppVar14 = local_48.p;
      }
      else {
        boost::unordered::detail::foa::
        table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxNode_const*,slang::ast::ConfigRule_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxNode_const*,void>,std::equal_to<slang::syntax::SyntaxNode_const*>,std::allocator<std::pair<slang::syntax::SyntaxNode_const*const,slang::ast::ConfigRule_const*>>>
        ::
        unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::syntax::SyntaxNode_const*>
                  (&local_48,
                   (table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxNode_const*,slang::ast::ConfigRule_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxNode_const*,void>,std::equal_to<slang::syntax::SyntaxNode_const*>,std::allocator<std::pair<slang::syntax::SyntaxNode_const*const,slang::ast::ConfigRule_const*>>>
                    *)local_70,hash,&local_71,&local_68);
        ppVar14 = local_48.p;
      }
    }
    ppVar14->second = pCVar5;
  }
  iVar23 = boost::unordered::detail::foa::
           table<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>_>_>
           ::begin((table<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>_>_>
                    *)node);
  ppVar13 = iVar23.p_;
joined_r0x007899ca:
  if (ppVar13 == (table_element_pointer)0x0) {
    return;
  }
  registerRules(this,&(iVar23.p_)->second);
  puVar11 = iVar23.pc_ + 2;
  do {
    puVar15 = puVar11;
    puVar11 = iVar23.pc_;
    ppVar13 = iVar23.p_ + 1;
    if (((uint)iVar23.pc_ & 0xf) == 0xe) goto LAB_00789a20;
    puVar1 = puVar15 + -1;
    iVar23.p_ = ppVar13;
    iVar23.pc_ = puVar11 + 1;
    puVar11 = puVar15 + 1;
  } while (*puVar1 == '\0');
  puVar15 = puVar15 + -1;
  if (*puVar1 == '\x01') {
    ppVar13 = (table_element_pointer)0x0;
  }
  goto LAB_00789a14;
LAB_00789a20:
  do {
    auVar18[0] = -(*puVar15 == '\0');
    auVar18[1] = -(puVar15[1] == '\0');
    auVar18[2] = -(puVar15[2] == '\0');
    auVar18[3] = -(puVar15[3] == '\0');
    auVar18[4] = -(puVar15[4] == '\0');
    auVar18[5] = -(puVar15[5] == '\0');
    auVar18[6] = -(puVar15[6] == '\0');
    auVar18[7] = -(puVar15[7] == '\0');
    auVar18[8] = -(puVar15[8] == '\0');
    auVar18[9] = -(puVar15[9] == '\0');
    auVar18[10] = -(puVar15[10] == '\0');
    auVar18[0xb] = -(puVar15[0xb] == '\0');
    auVar18[0xc] = -(puVar15[0xc] == '\0');
    auVar18[0xd] = -(puVar15[0xd] == '\0');
    auVar18[0xe] = -(puVar15[0xe] == '\0');
    auVar18[0xf] = -(puVar15[0xf] == '\0');
    uVar12 = (uint)(ushort)((ushort)(SUB161(auVar18 >> 7,0) & 1) |
                            (ushort)(SUB161(auVar18 >> 0xf,0) & 1) << 1 |
                            (ushort)(SUB161(auVar18 >> 0x17,0) & 1) << 2 |
                            (ushort)(SUB161(auVar18 >> 0x1f,0) & 1) << 3 |
                            (ushort)(SUB161(auVar18 >> 0x27,0) & 1) << 4 |
                            (ushort)(SUB161(auVar18 >> 0x2f,0) & 1) << 5 |
                            (ushort)(SUB161(auVar18 >> 0x37,0) & 1) << 6 |
                            (ushort)(SUB161(auVar18 >> 0x3f,0) & 1) << 7 |
                            (ushort)(SUB161(auVar18 >> 0x47,0) & 1) << 8 |
                            (ushort)(SUB161(auVar18 >> 0x4f,0) & 1) << 9 |
                            (ushort)(SUB161(auVar18 >> 0x57,0) & 1) << 10 |
                            (ushort)(SUB161(auVar18 >> 0x5f,0) & 1) << 0xb |
                            (ushort)(SUB161(auVar18 >> 0x67,0) & 1) << 0xc |
                            (ushort)(SUB161(auVar18 >> 0x6f,0) & 1) << 0xd |
                           (ushort)(SUB161(auVar18 >> 0x77,0) & 1) << 0xe);
    if (uVar12 == 0x7fff) {
      puVar15 = puVar15 + 0x10;
      ppVar13 = ppVar13 + 0xf;
    }
    else {
      uVar8 = 0;
      if ((uVar12 ^ 0x7fff) != 0) {
        for (; ((uVar12 ^ 0x7fff) >> uVar8 & 1) == 0; uVar8 = uVar8 + 1) {
        }
      }
      if (puVar15[uVar8] == '\x01') {
        ppVar13 = (table_element_pointer)0x0;
      }
      else {
        puVar15 = puVar15 + uVar8;
        ppVar13 = ppVar13 + uVar8;
      }
    }
  } while (uVar12 == 0x7fff);
LAB_00789a14:
  iVar23.p_ = ppVar13;
  iVar23.pc_ = puVar15;
  goto joined_r0x007899ca;
}

Assistant:

void ConfigBlockSymbol::registerRules(const InstanceOverride& node) const {
    if (node.rule)
        ruleBySyntax[node.rule->syntax] = node.rule;

    for (auto& [_, child] : node.childNodes)
        registerRules(child);
}